

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator+(TPZSFMatrix<long_double> *this,TPZMatrix<long_double> *A)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TPZSFMatrix<long_double> *in_RDX;
  TPZSFMatrix<long_double> *in_RSI;
  TPZSFMatrix<long_double> *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  int64_t r;
  int64_t c;
  longdouble *pr;
  TPZSFMatrix<long_double> *res;
  char *in_stack_00000178;
  char *in_stack_00000180;
  long local_48;
  long local_30;
  longdouble *local_28;
  TPZSFMatrix<long_double> *this_00;
  
  this_00 = in_RSI;
  iVar1 = (*(in_RSI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar2 = (*(in_RDX->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if (CONCAT44(extraout_var,iVar1) != CONCAT44(extraout_var_00,iVar2)) {
    TPZMatrix<long_double>::Error(in_stack_00000180,in_stack_00000178);
  }
  TPZSFMatrix(this_00,in_RDX);
  local_28 = in_RDI->fElem;
  for (local_30 = 0;
      iVar1 = (*(in_RSI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(), local_30 < CONCAT44(extraout_var_01,iVar1);
      local_30 = local_30 + 1) {
    for (local_48 = 0; local_48 <= local_30; local_48 = local_48 + 1) {
      (*(in_RDX->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x21])(in_RDX,local_48,local_30);
      *local_28 = *local_28 + in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      local_28 = local_28 + 1;
    }
  }
  return in_RDI;
}

Assistant:

TPZSFMatrix<TVar>
TPZSFMatrix<TVar> ::operator+(const TPZMatrix<TVar>  &A ) const
{
	if ( this->Dim() != A.Dim() )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__,"Operator+ <matrixs with incoompatible dimensions" );
	
	auto  res(*this);
	TVar *pr = res.fElem;
	for ( int64_t c = 0; c < this->Dim(); c++ )
		for ( int64_t r = 0; r <= c; r++ )
			*pr++ += A.Get( r, c );
	
	return res;
}